

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

void Js::CompoundString::AppendGeneric<Js::CompoundString>
               (char16 c,CompoundString *toString,bool appendChars)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  JavascriptString *s;
  char16_t *pcVar5;
  
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3d2,"(toString)","toString");
    if (!bVar2) goto LAB_00b2bd8b;
    *puVar3 = 0;
  }
  pcVar4 = JavascriptString::UnsafeGetBuffer((JavascriptString *)toString);
  if (pcVar4 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3d3,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00b2bd8b;
    *puVar3 = 0;
  }
  if (toString->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3d4,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00b2bd8b;
    *puVar3 = 0;
  }
  if ((appendChars) && (toString->directCharLength != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3d5,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) {
LAB_00b2bd8b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  if (bVar2) {
    pcVar5 = L"false";
    if (appendChars) {
      pcVar5 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(\'%c\', appendChars = %s)\n",(ulong)(ushort)c,
                  pcVar5);
    Output::Flush();
  }
  if ((appendChars) || (toString->directCharLength == 0xffffffff)) {
    bVar2 = TryAppendGeneric<Js::CompoundString>(c,toString);
  }
  else {
    s = CharStringCache::GetStringForChar
                  (&((((toString->super_LiteralString).super_JavascriptString.super_RecyclableObject
                       .type.ptr)->javascriptLibrary).ptr)->charStringCache,c);
    bVar2 = TryAppendGeneric<Js::CompoundString>(s,1,toString);
  }
  if (bVar2 != false) {
    return;
  }
  AppendSlow(toString,c);
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(const char16 c, String *const toString, const bool appendChars)
    {
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(_u("CompoundString::AppendGeneric('%c', appendChars = %s)\n"), c, appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars()
                ? TryAppendGeneric(c, toString)
                : TryAppendGeneric(toString->GetLibrary()->GetCharStringCache().GetStringForChar(c), 1, toString))
        {
            return;
        }
        toString->AppendSlow(c);
    }